

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgmres.hpp
# Opt level: O2

void __thiscall Cgmres<Model>::Ax_func(Cgmres<Model> *this,double *Ax,double *dUdt)

{
  double U_buf [75];
  
  mul(U_buf,dUdt,0.002,0x4b);
  add(U_buf,U_buf,this->U,0x4b);
  F_func(this,Ax,U_buf,this->x_dxh,this->t + 0.002);
  sub(Ax,Ax,this->F_dxh_h,0x4b);
  div((int)Ax,(int)Ax);
  return;
}

Assistant:

void Ax_func(double* Ax, const double* dUdt) override {
    double U_buf[len];

    // F(U + dUdt * h, x + dxdt * h, t + h)
    mul(U_buf, dUdt, h, len);
    add(U_buf, U_buf, U, len);
    F_func(Ax, U_buf, x_dxh, t + h);

    // Ax = (F(U + dUdt * h, x + dxdt * h, t + h) - F(U, x + dxdt * h, t + h)) / h
    sub(Ax, Ax, F_dxh_h, len);
    div(Ax, Ax, h, len);
  }